

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_dispatch_loop.h
# Opt level: O0

void parse_dispatch(vw *all,dispatch_fptr *dispatch)

{
  int iVar1;
  size_t sVar2;
  long in_RDI;
  vw_exception *e;
  exception *e_1;
  size_t example_number;
  v_array<example_*> examples;
  size_t in_stack_000004d8;
  vw *in_stack_000004e0;
  example **in_stack_fffffffffffffef8;
  vw *in_stack_ffffffffffffff00;
  vw *in_stack_ffffffffffffff08;
  function<void_(vw_&,_v_array<example_*>_&)> *in_stack_ffffffffffffff10;
  v_array<example_*> *in_stack_ffffffffffffff18;
  vw *in_stack_ffffffffffffff20;
  ulong local_38;
  v_array<example_*> local_30;
  long local_8;
  
  local_8 = in_RDI;
  v_init<example*>();
  local_38 = 0;
  do {
    if (((*(byte *)(*(long *)(local_8 + 8) + 0x298) ^ 0xff) & 1) == 0) {
      lock_done((parser *)0x248014);
      v_array<example_*>::delete_v((v_array<example_*> *)in_stack_ffffffffffffff00);
      return;
    }
    VW::get_unused_example(in_stack_ffffffffffffff00);
    v_array<example_*>::push_back
              ((v_array<example_*> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    if ((((*(byte *)(local_8 + 0x3456) & 1) == 0) && (local_38 != *(ulong *)(local_8 + 0x340))) &&
       (local_38 < *(ulong *)(local_8 + 0x3610))) {
      iVar1 = (**(code **)(*(long *)(local_8 + 8) + 0x1f0))(local_8,&local_30);
      if (iVar1 < 1) goto LAB_002480c7;
      VW::setup_examples(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      sVar2 = v_array<example_*>::size(&local_30);
      local_38 = local_38 + sVar2;
      std::function<void_(vw_&,_v_array<example_*>_&)>::operator()
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 (v_array<example_*> *)in_stack_ffffffffffffff00);
    }
    else {
LAB_002480c7:
      reset_source(in_stack_000004e0,in_stack_000004d8);
      *(undefined1 *)(local_8 + 0x3456) = 0;
      *(long *)(local_8 + 0x350) = *(long *)(local_8 + 0x350) + 1;
      in_stack_ffffffffffffff00 = *(vw **)(*(long *)(local_8 + 8) + 0x338);
      in_stack_ffffffffffffff08 = (vw *)v_array<example_*>::operator[](&local_30,0);
      (*(code *)in_stack_ffffffffffffff00)(&((example *)in_stack_ffffffffffffff08->sd)->l);
      in_stack_fffffffffffffef8 = v_array<example_*>::operator[](&local_30,0);
      (*in_stack_fffffffffffffef8)->end_pass = true;
      *(undefined4 *)(*(long *)(local_8 + 8) + 0x238) = 0;
      if ((*(long *)(local_8 + 0x350) == *(long *)(local_8 + 0x348)) &&
         (local_38 == *(ulong *)(local_8 + 0x340))) {
        *(undefined8 *)(local_8 + 0x350) = 0;
        *(long *)(local_8 + 0x340) = *(long *)(local_8 + 0x340) * 2 + 1;
      }
      std::function<void_(vw_&,_v_array<example_*>_&)>::operator()
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 (v_array<example_*> *)in_stack_ffffffffffffff00);
      if ((*(ulong *)(local_8 + 0x348) <= *(ulong *)(local_8 + 0x350)) &&
         (local_38 <= *(ulong *)(local_8 + 0x3610))) {
        lock_done((parser *)0x248260);
      }
      local_38 = 0;
    }
    v_array<example_*>::clear((v_array<example_*> *)in_stack_ffffffffffffff00);
  } while( true );
}

Assistant:

inline void parse_dispatch(vw& all, dispatch_fptr dispatch)
{
  v_array<example*> examples = v_init<example*>();
  size_t example_number = 0;  // for variable-size batch learning algorithms

  try
  {
    while (!all.p->done)
    {
      examples.push_back(&VW::get_unused_example(&all));  // need at least 1 example
      if (!all.do_reset_source && example_number != all.pass_length && all.max_examples > example_number &&
          all.p->reader(&all, examples) > 0)
      {
        VW::setup_examples(all, examples);
        example_number += examples.size();
        dispatch(all, examples);
      }
      else
      {
        reset_source(all, all.num_bits);
        all.do_reset_source = false;
        all.passes_complete++;

        // setup an end_pass example
        all.p->lp.default_label(&examples[0]->l);
        examples[0]->end_pass = true;
        all.p->in_pass_counter = 0;

        if (all.passes_complete == all.numpasses && example_number == all.pass_length)
        {
          all.passes_complete = 0;
          all.pass_length = all.pass_length * 2 + 1;
        }
        dispatch(all, examples);  // must be called before lock_done or race condition exists.
        if (all.passes_complete >= all.numpasses && all.max_examples >= example_number)
          lock_done(*all.p);
        example_number = 0;
      }

      examples.clear();
    }
  }
  catch (VW::vw_exception& e)
  {
    std::cerr << "vw example #" << example_number << "(" << e.Filename() << ":" << e.LineNumber() << "): " << e.what()
              << std::endl;
  }
  catch (std::exception& e)
  {
    std::cerr << "vw: example #" << example_number << e.what() << std::endl;
  }
  lock_done(*all.p);
  examples.delete_v();
}